

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int copyEntityTable(XML_Parser oldParser,HASH_TABLE *newTable,STRING_POOL *newPool,
                   HASH_TABLE *oldTable)

{
  NAMED *pNVar1;
  XML_Char *pXVar2;
  NAMED *pNVar3;
  XML_Char *tem_2;
  XML_Char *tem_1;
  XML_Char *tem;
  ENTITY *oldE;
  XML_Char *name;
  ENTITY *newE;
  XML_Char *cachedNewBase;
  XML_Char *cachedOldBase;
  HASH_TABLE_ITER iter;
  HASH_TABLE *oldTable_local;
  STRING_POOL *newPool_local;
  HASH_TABLE *newTable_local;
  XML_Parser oldParser_local;
  
  cachedNewBase = (XML_Char *)0x0;
  newE = (ENTITY *)0x0;
  iter.end = (NAMED **)oldTable;
  hashTableIterInit((HASH_TABLE_ITER *)&cachedOldBase,oldTable);
  while( true ) {
    pNVar1 = hashTableIterNext((HASH_TABLE_ITER *)&cachedOldBase);
    if (pNVar1 == (NAMED *)0x0) {
      return 1;
    }
    pXVar2 = poolCopyString(newPool,pNVar1->name);
    if (pXVar2 == (XML_Char *)0x0) break;
    pNVar3 = lookup(oldParser,newTable,pXVar2,0x40);
    if (pNVar3 == (NAMED *)0x0) {
      return 0;
    }
    if (pNVar1[3].name == (KEY)0x0) {
      pXVar2 = poolCopyStringN(newPool,pNVar1[1].name,*(int *)&pNVar1[2].name);
      if (pXVar2 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar3[1].name = pXVar2;
      *(undefined4 *)&pNVar3[2].name = *(undefined4 *)&pNVar1[2].name;
    }
    else {
      pXVar2 = poolCopyString(newPool,pNVar1[3].name);
      if (pXVar2 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar3[3].name = pXVar2;
      if (pNVar1[4].name != (KEY)0x0) {
        if (pNVar1[4].name == cachedNewBase) {
          pNVar3[4].name = (KEY)newE;
        }
        else {
          cachedNewBase = pNVar1[4].name;
          newE = (ENTITY *)poolCopyString(newPool,cachedNewBase);
          if (newE == (ENTITY *)0x0) {
            return 0;
          }
          pNVar3[4].name = (KEY)newE;
        }
      }
      if (pNVar1[5].name != (KEY)0x0) {
        pXVar2 = poolCopyString(newPool,pNVar1[5].name);
        if (pXVar2 == (XML_Char *)0x0) {
          return 0;
        }
        pNVar3[5].name = pXVar2;
      }
    }
    if (pNVar1[6].name != (KEY)0x0) {
      pXVar2 = poolCopyString(newPool,pNVar1[6].name);
      if (pXVar2 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar3[6].name = pXVar2;
    }
    *(undefined1 *)((long)&pNVar3[7].name + 1) = *(undefined1 *)((long)&pNVar1[7].name + 1);
    *(undefined1 *)((long)&pNVar3[7].name + 2) = *(undefined1 *)((long)&pNVar1[7].name + 2);
  }
  return 0;
}

Assistant:

static int
copyEntityTable(XML_Parser oldParser, HASH_TABLE *newTable,
                STRING_POOL *newPool, const HASH_TABLE *oldTable) {
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = NULL;
  const XML_Char *cachedNewBase = NULL;

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (! oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (! name)
      return 0;
    newE = (ENTITY *)lookup(oldParser, newTable, name, sizeof(ENTITY));
    if (! newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (! tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (! tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
      if (oldE->publicId) {
        tem = poolCopyString(newPool, oldE->publicId);
        if (! tem)
          return 0;
        newE->publicId = tem;
      }
    } else {
      const XML_Char *tem
          = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (! tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (! tem)
        return 0;
      newE->notation = tem;
    }
    newE->is_param = oldE->is_param;
    newE->is_internal = oldE->is_internal;
  }
  return 1;
}